

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O3

void mkundead(level *lev,coord *mm,boolean revive_corpses,int mm_flags)

{
  undefined1 *puVar1;
  xchar xVar2;
  boolean bVar3;
  uint uVar4;
  permonst *mdat;
  obj *obj;
  monst *pmVar5;
  undefined7 in_register_00000011;
  int iVar6;
  coord cc;
  coord local_3a;
  int local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,revive_corpses);
  local_38 = mm_flags;
  xVar2 = level_difficulty(&lev->z);
  iVar6 = xVar2 * 0x6667 + 0x6667;
  iVar6 = (iVar6 >> 0x12) - (iVar6 >> 0x1f);
  uVar4 = mt_random();
  if (uVar4 % 5 + 1 + iVar6 != 0) {
    iVar6 = uVar4 + iVar6 + (uVar4 / 5) * -5 + 1;
    do {
      mdat = morguemon(&lev->z);
      bVar3 = enexto(&local_3a,lev,mm->x,mm->y,mdat);
      if (bVar3 != '\0') {
        if ((char)local_34 != '\0') {
          obj = sobj_at(0x10e,lev,(int)local_3a.x,(int)local_3a.y);
          if (obj != (obj *)0x0) {
            pmVar5 = revive(obj);
            if (pmVar5 != (monst *)0x0) goto LAB_001e583c;
          }
        }
        makemon(mdat,lev,(int)local_3a.x,(int)local_3a.y,local_38);
      }
LAB_001e583c:
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  puVar1 = &(lev->flags).field_0xa;
  *puVar1 = *puVar1 | 1;
  return;
}

Assistant:

void mkundead(struct level *lev, coord *mm, boolean revive_corpses, int mm_flags)
{
	int cnt = (level_difficulty(&lev->z) + 1)/10 + rnd(5);
	const struct permonst *mdat;
	struct obj *otmp;
	coord cc;

	while (cnt--) {
	    mdat = morguemon(&lev->z);
	    if (enexto(&cc, lev, mm->x, mm->y, mdat) &&
		    (!revive_corpses ||
		     !(otmp = sobj_at(CORPSE, lev, cc.x, cc.y)) ||
		     !revive(otmp)))
		makemon(mdat, lev, cc.x, cc.y, mm_flags);
	}
	lev->flags.graveyard = TRUE;	/* reduced chance for undead corpse */
}